

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallExportGenerator::GenerateScriptConfigs
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  long *plVar1;
  pointer pbVar2;
  pointer pbVar3;
  cmInstallExportGenerator *this_00;
  ostream *poVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string config_test;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  cmInstallExportGenerator *local_50;
  ulong local_48;
  string *local_40;
  _Rb_tree_node_base *local_38;
  
  cmScriptGenerator::GenerateScriptConfigs((cmScriptGenerator *)this,os,indent);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var5 = (this->EFGen->ConfigImportFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(this->EFGen->ConfigImportFiles)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != local_38) {
    local_40 = &(this->super_cmInstallGenerator).Destination;
    local_50 = this;
    local_48 = (ulong)(uint)indent.Level;
    do {
      uVar8 = local_48;
      this_00 = local_50;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_88,(value_type *)(p_Var5 + 2));
      cmScriptGenerator::CreateConfigTest
                (&local_70,(cmScriptGenerator *)this_00,(string *)(p_Var5 + 1));
      if (0 < (int)uVar8) {
        uVar7 = uVar8 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar6 = (int)uVar7 - 1;
          uVar7 = (ulong)uVar6;
        } while (uVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
      cmInstallGenerator::AddInstallRule
                (&this_00->super_cmInstallGenerator,os,local_40,cmInstallType_FILES,&local_88,false,
                 (this_00->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
                 (Indent)(indent.Level + 2));
      if (0 < (int)uVar8) {
        uVar8 = uVar8 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar6 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar6;
        } while (uVar6 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
      pbVar3 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar9 = &(local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar9 + -1))->_M_dataplus)._M_p;
          if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)plVar1) {
            operator_delete(plVar1,paVar9->_M_allocated_capacity + 1);
          }
          pbVar10 = (pointer)(paVar9 + 1);
          paVar9 = paVar9 + 2;
        } while (pbVar10 != pbVar3);
        local_88.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_38);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptConfigs(std::ostream& os,
                                                     Indent indent)
{
  // Create the main install rules first.
  this->cmInstallGenerator::GenerateScriptConfigs(os, indent);

  // Now create a configuration-specific install rule for the import
  // file of each configuration.
  std::vector<std::string> files;
  for (auto const& i : this->EFGen->GetConfigImportFiles()) {
    files.push_back(i.second);
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }
}